

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spp.cpp
# Opt level: O1

int __thiscall
SPP::solveSPP(SPP *this,Satellite **GPSPosAndVel,Satellite **BDSPosAndVel,Obs **GPSObs,Obs **BDSObs,
             Ephemeris **GPSEph,Ephemeris **BDSEph,ELLIPSOID type)

{
  undefined8 *puVar1;
  Satellite *pSVar2;
  double dVar3;
  XYZ SatPosition;
  XYZ station;
  XYZ SatPosition_00;
  XYZ station_00;
  Vector3d b;
  Vector3d b_00;
  XYZ obj;
  XYZ obj_00;
  Vector3d a;
  Vector3d a_00;
  SPP *pSVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  ulong uVar9;
  Satellite **ppSVar10;
  double dVar11;
  XYZ *pXVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  int i;
  uint row;
  int iVar16;
  long lVar17;
  long lVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  MatrixXd tmp2;
  MatrixXd B_T;
  Vector3d RefPos;
  MatrixXd tmp1;
  int flag;
  Vector3d dx;
  XYZ NEU;
  MatrixXd tmp3;
  MatrixXd w;
  MatrixXd P;
  MatrixXd B;
  MatrixXd v;
  MatrixXd tmp5;
  MatrixXd tmp4;
  MatrixXd tmp10;
  MatrixXd tmp9;
  MatrixXd tmp8;
  MatrixXd tmp7;
  MatrixXd tmp6;
  double dVar21;
  double *in_stack_fffffffffffffdb0;
  double *in_stack_fffffffffffffdb8;
  double *in_stack_fffffffffffffdc0;
  Matrix<double,_3,_1> local_1f8;
  undefined8 local_1e8;
  SPP *local_1e0;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  XYZ local_1b8;
  Matrix<double,_3,_1> local_1a0;
  ulong local_190;
  double local_188;
  Matrix<double,__1,__1> local_180;
  double local_170;
  int local_168;
  int local_164;
  double local_160;
  double local_158;
  Satellite **local_150;
  Matrix<double,_3,_1> local_148;
  ulong local_138;
  ulong local_130;
  Satellite **local_128;
  XYZ local_120;
  Matrix<double,__1,__1> local_108;
  Matrix<double,__1,__1> local_f8;
  Matrix<double,__1,__1> local_e8;
  Matrix<double,__1,__1> local_d8;
  Obs **local_c8;
  Obs **local_c0;
  Matrix<double,__1,__1> local_b8;
  Matrix<double,__1,__1> local_a8;
  Matrix<double,__1,__1> local_98;
  double local_88;
  Matrix<double,__1,__1> local_80;
  Matrix<double,__1,__1> local_70;
  Matrix<double,__1,__1> local_60;
  Matrix<double,__1,__1> local_50;
  Matrix<double,__1,__1> local_40;
  
  local_130 = 0;
  lVar6 = 0x90;
  do {
    uVar13 = (int)local_130 +
             (uint)(*(double *)((long)&((*GPSPosAndVel)->SatPosition).X + lVar6) != -1.0);
    local_130 = (ulong)uVar13;
    lVar6 = lVar6 + 0xb8;
  } while (lVar6 != 0x1790);
  local_190 = 0;
  lVar6 = 0x90;
  do {
    uVar14 = (int)local_190 +
             (uint)(*(double *)((long)&((*BDSPosAndVel)->SatPosition).X + lVar6) != -1.0);
    local_190 = (ulong)uVar14;
    lVar6 = lVar6 + 0xb8;
  } while (lVar6 != 0x2e90);
  (this->result).BDSObsNum = uVar14;
  (this->result).GPSObsNum = uVar13;
  iVar16 = 1;
  if (((uVar14 != 0 || 4 < uVar13) && (4 < uVar14 || uVar13 != 0)) &&
     ((row = uVar14 + uVar13, uVar13 == 0 || ((uVar14 == 0 || (4 < row)))))) {
    uVar13 = (uint)(uVar13 == 0 || uVar14 == 0);
    local_1a0.data = (double *)0x0;
    local_1a0.rows = 3;
    local_1a0.cols = 1;
    local_1e0 = this;
    local_128 = BDSPosAndVel;
    local_c8 = GPSObs;
    local_c0 = BDSObs;
    local_1a0.data = (double *)operator_new__(0x18);
    Matrix<double,_3,_1>::Zero(&local_1a0);
    Matrix<double,_-1,_-1>::Matrix(&local_d8,row,uVar13 ^ 5);
    Matrix<double,_-1,_-1>::Matrix(&local_e8,local_d8.rows,local_d8.rows);
    Matrix<double,_-1,_-1>::Matrix(&local_f8,local_d8.rows,1);
    Matrix<double,_-1,_-1>::Zero(&local_d8);
    Matrix<double,_-1,_-1>::Zero(&local_e8);
    local_158 = (local_1e0->result).GPSR;
    local_160 = (local_1e0->result).BDSR;
    local_88 = (double)(int)((uVar13 - 5) + row);
    local_168 = 4 - (uint)((int)local_130 == 0);
    local_138 = 0;
    local_150 = GPSPosAndVel;
    do {
      if (10 < (int)local_138) goto LAB_0010e5fd;
      XYZ::XYZ(&local_120);
      uVar9 = local_190;
      if ((int)local_130 == 0) {
        local_1e8 = (double)((ulong)local_1e8._4_4_ << 0x20);
      }
      else {
        lVar17 = 0;
        lVar6 = 500;
        dVar11 = 8.14220184346374e-321;
        lVar15 = 0;
        local_1e8 = (double)((ulong)local_1e8._4_4_ << 0x20);
        uVar7 = local_130;
        do {
          pSVar4 = local_1e0;
          dVar21 = *(double *)((long)&(*GPSPosAndVel)->n + lVar15);
          if ((dVar21 != -1.0) || (NAN(dVar21))) {
            puVar1 = (undefined8 *)((long)(*local_c8)->psr + lVar17 + -0x10);
            dVar21 = (double)puVar1[1];
            *(undefined8 *)&(local_1e0->result).ObsTime = *puVar1;
            (local_1e0->result).ObsTime.SOW = dVar21;
            pXVar12 = &local_1b8;
            XYZ::XYZ(pXVar12);
            pSVar2 = *GPSPosAndVel;
            dVar21 = *(double *)((long)&(pSVar2->SatPosition).Z + lVar15);
            SatPosition.Z = dVar21;
            SatPosition._0_16_ = *(undefined1 (*) [16])((long)&(pSVar2->SatPosition).X + lVar15);
            EarthRotationFix((SPP *)pXVar12,*(double *)((long)&pSVar2->deltat + lVar15),SatPosition,
                             GPS,&local_1b8);
            *(double *)((long)&(pSVar4->result).UserPositionXYZ.X + (long)dVar11) = local_1b8.Z;
            pdVar5 = (double *)((long)&(pSVar4->result).ObsTime.Week + (long)dVar11);
            *pdVar5 = local_1b8.X;
            pdVar5[1] = local_1b8.Y;
            local_1f8 = (Matrix<double,_3,_1>)ZEXT816(0x100000003);
            local_188 = dVar11;
            pdVar5 = (double *)operator_new__(0x18);
            local_1f8.data = pdVar5;
            dVar11 = local_1b8.X;
            pdVar5 = Matrix<double,_3,_1>::operator()(&local_1f8,0,0);
            *pdVar5 = dVar11;
            dVar11 = local_1b8.Y;
            pdVar5 = Matrix<double,_3,_1>::operator()(&local_1f8,1,0);
            dVar8 = local_1b8.Z;
            *pdVar5 = dVar11;
            pdVar5 = Matrix<double,_3,_1>::operator()(&local_1f8,2,0);
            *pdVar5 = dVar8;
            a.data = in_stack_fffffffffffffdc0;
            a._0_8_ = in_stack_fffffffffffffdb8;
            b.data = in_stack_fffffffffffffdb0;
            b._0_8_ = dVar21;
            dVar11 = dist(a,b);
            pdVar5 = Matrix<double,_3,_1>::operator()(&local_1a0,0,0);
            local_1c0 = *pdVar5;
            pdVar5 = Matrix<double,_3,_1>::operator()(&local_1f8,0,0);
            local_1c0 = (local_1c0 - *pdVar5) / dVar11;
            pdVar5 = Matrix<double,_3,_1>::operator()(&local_1a0,1,0);
            local_1c8 = *pdVar5;
            pdVar5 = Matrix<double,_3,_1>::operator()(&local_1f8,1,0);
            local_1c8 = (local_1c8 - *pdVar5) / dVar11;
            pdVar5 = Matrix<double,_3,_1>::operator()(&local_1a0,2,0);
            local_1d0 = *pdVar5;
            pdVar5 = Matrix<double,_3,_1>::operator()(&local_1f8,2,0);
            local_1d0 = (local_1d0 - *pdVar5) / dVar11;
            *(double *)((long)pSVar4 + lVar6 * 8 + -0x600) = dVar11;
            XYZ::XYZ((XYZ *)&local_180);
            pdVar5 = Matrix<double,_3,_1>::operator()(&local_1a0,0,0);
            local_120.X = *pdVar5;
            pdVar5 = Matrix<double,_3,_1>::operator()(&local_1a0,1,0);
            local_120.Y = *pdVar5;
            pdVar5 = Matrix<double,_3,_1>::operator()(&local_1a0,2,0);
            local_120.Z = *pdVar5;
            in_stack_fffffffffffffdb0 = (double *)local_1b8.X;
            in_stack_fffffffffffffdb8 = (double *)local_1b8.Y;
            station.Y = local_120.Y;
            station.X = local_120.X;
            station.Z = local_120.Z;
            obj.Z = local_1b8.Z;
            obj.X = local_1b8.X;
            obj.Y = local_1b8.Y;
            in_stack_fffffffffffffdc0 = (double *)local_1b8.Z;
            XYZ2NEU(station,obj,type,(XYZ *)&local_180);
            uVar19 = SUB84(local_170,0);
            uVar20 = (undefined4)((ulong)local_170 >> 0x20);
            dVar21 = (double)local_180._0_8_ * (double)local_180._0_8_ +
                     (double)local_180.data * (double)local_180.data;
            if (dVar21 < 0.0) {
              local_1d8 = local_170;
              dVar21 = sqrt(dVar21);
              uVar19 = SUB84(local_1d8,0);
              uVar20 = (undefined4)((ulong)local_1d8 >> 0x20);
            }
            else {
              dVar21 = SQRT(dVar21);
            }
            local_1d8 = atan((double)CONCAT44(uVar20,uVar19) / dVar21);
            dVar21 = atan2((double)local_180._0_8_,(double)local_180.data);
            pSVar4 = local_1e0;
            *(double *)((long)local_1e0 + lVar6 * 8 + -0x300) = local_1d8;
            *(double *)(&(local_1e0->result).ObsTime.Week + lVar6 * 2) = dVar21;
            dVar8 = Hopefield(local_1d8,(local_1e0->result).UserPositionBLH.H,15.0,1013.25,0.5);
            dVar21 = (pSVar4->result).UserPositionBLH.H;
            dVar11 = (*(double *)((long)&(*local_150)->clkdif + lVar15) * 299792458.0 +
                     ((*(double *)((long)(*local_c8)->psr + lVar17) * 2.54572778016316 +
                      *(double *)((long)(*local_c8)->psr + lVar17 + 8) * -1.5457277801631601) -
                     dVar11)) - local_158;
            iVar16 = (int)local_1e8;
            pdVar5 = Matrix<double,_-1,_-1>::operator()(&local_f8,(int)local_1e8,0);
            *pdVar5 = dVar11 - (double)(~-(ulong)(5000.0 < dVar21) & (ulong)dVar8);
            pdVar5 = Matrix<double,_-1,_-1>::operator()(&local_d8,iVar16,0);
            *pdVar5 = local_1c0;
            pdVar5 = Matrix<double,_-1,_-1>::operator()(&local_d8,iVar16,1);
            *pdVar5 = local_1c8;
            pdVar5 = Matrix<double,_-1,_-1>::operator()(&local_d8,iVar16,2);
            *pdVar5 = local_1d0;
            pdVar5 = Matrix<double,_-1,_-1>::operator()(&local_d8,iVar16,3);
            *pdVar5 = 1.0;
            pdVar5 = Matrix<double,_-1,_-1>::operator()(&local_e8,iVar16,iVar16);
            *pdVar5 = 1.0;
            if (local_1f8.data != (double *)0x0) {
              operator_delete__(local_1f8.data);
            }
            local_1e8 = (double)CONCAT44(local_1e8._4_4_,(int)local_1e8 + 1);
            uVar7 = local_130;
            uVar9 = local_190;
            GPSPosAndVel = local_150;
            dVar11 = local_188;
          }
          if (0x1e < lVar6 - 500U) break;
          lVar6 = lVar6 + 1;
          dVar11 = (double)((long)dVar11 + 0x18);
          lVar15 = lVar15 + 0xb8;
          lVar17 = lVar17 + 0x70;
        } while ((int)uVar7 != 0);
      }
      if ((int)uVar9 != 0) {
        lVar6 = 0x70;
        lVar18 = 0x15;
        lVar15 = 0;
        lVar17 = 0;
        dVar11 = 0.0;
        ppSVar10 = local_128;
        do {
          dVar21 = *(double *)((long)&(*ppSVar10)->n + lVar15);
          if ((dVar21 != -1.0) || (dVar8 = dVar11, NAN(dVar21))) {
            pXVar12 = &local_1b8;
            local_1c0 = dVar11;
            XYZ::XYZ(&local_1b8);
            pSVar2 = *ppSVar10;
            dVar11 = *(double *)((long)&(pSVar2->SatPosition).Z + lVar15);
            SatPosition_00.Z = dVar11;
            SatPosition_00._0_16_ = *(undefined1 (*) [16])((long)&(pSVar2->SatPosition).X + lVar15);
            EarthRotationFix((SPP *)pXVar12,*(double *)((long)&pSVar2->deltat + lVar15),
                             SatPosition_00,BDS,&local_1b8);
            pSVar4 = local_1e0;
            *(double *)((long)&(local_1e0->result).UserPositionXYZ.X + lVar6) = local_1b8.Z;
            pdVar5 = (double *)((long)&(local_1e0->result).ObsTime.Week + lVar6);
            *pdVar5 = local_1b8.X;
            pdVar5[1] = local_1b8.Y;
            puVar1 = (undefined8 *)((long)(*local_c0)->psr + lVar17 + -0x10);
            dVar21 = (double)puVar1[1];
            *(undefined8 *)&(local_1e0->result).ObsTime = *puVar1;
            (local_1e0->result).ObsTime.SOW = dVar21;
            local_1f8 = (Matrix<double,_3,_1>)ZEXT816(0x100000003);
            pdVar5 = (double *)operator_new__(0x18);
            local_1f8.data = pdVar5;
            dVar21 = local_1b8.X;
            pdVar5 = Matrix<double,_3,_1>::operator()(&local_1f8,0,0);
            *pdVar5 = dVar21;
            dVar21 = local_1b8.Y;
            pdVar5 = Matrix<double,_3,_1>::operator()(&local_1f8,1,0);
            dVar8 = local_1b8.Z;
            *pdVar5 = dVar21;
            pdVar5 = Matrix<double,_3,_1>::operator()(&local_1f8,2,0);
            *pdVar5 = dVar8;
            a_00.data = in_stack_fffffffffffffdc0;
            a_00._0_8_ = in_stack_fffffffffffffdb8;
            b_00.data = in_stack_fffffffffffffdb0;
            b_00._0_8_ = dVar11;
            dVar11 = dist(a_00,b_00);
            pdVar5 = Matrix<double,_3,_1>::operator()(&local_1a0,0,0);
            local_1c8 = *pdVar5;
            pdVar5 = Matrix<double,_3,_1>::operator()(&local_1f8,0,0);
            local_1c8 = (local_1c8 - *pdVar5) / dVar11;
            pdVar5 = Matrix<double,_3,_1>::operator()(&local_1a0,1,0);
            local_1d0 = *pdVar5;
            pdVar5 = Matrix<double,_3,_1>::operator()(&local_1f8,1,0);
            local_1d0 = (local_1d0 - *pdVar5) / dVar11;
            pdVar5 = Matrix<double,_3,_1>::operator()(&local_1a0,2,0);
            local_188 = *pdVar5;
            pdVar5 = Matrix<double,_3,_1>::operator()(&local_1f8,2,0);
            local_188 = (local_188 - *pdVar5) / dVar11;
            (pSVar4->result).BDSDist[(long)local_1c0] = dVar11;
            XYZ::XYZ((XYZ *)&local_180);
            pdVar5 = Matrix<double,_3,_1>::operator()(&local_1a0,0,0);
            local_120.X = *pdVar5;
            pdVar5 = Matrix<double,_3,_1>::operator()(&local_1a0,1,0);
            local_120.Y = *pdVar5;
            pdVar5 = Matrix<double,_3,_1>::operator()(&local_1a0,2,0);
            local_120.Z = *pdVar5;
            in_stack_fffffffffffffdb0 = (double *)local_1b8.X;
            in_stack_fffffffffffffdb8 = (double *)local_1b8.Y;
            station_00.Y = local_120.Y;
            station_00.X = local_120.X;
            station_00.Z = local_120.Z;
            obj_00.Z = local_1b8.Z;
            obj_00.X = local_1b8.X;
            obj_00.Y = local_1b8.Y;
            in_stack_fffffffffffffdc0 = (double *)local_1b8.Z;
            XYZ2NEU(station_00,obj_00,type,(XYZ *)&local_180);
            uVar19 = SUB84(local_170,0);
            uVar20 = (undefined4)((ulong)local_170 >> 0x20);
            dVar21 = (double)local_180._0_8_ * (double)local_180._0_8_ +
                     (double)local_180.data * (double)local_180.data;
            if (dVar21 < 0.0) {
              local_1d8 = local_170;
              dVar21 = sqrt(dVar21);
              uVar19 = SUB84(local_1d8,0);
              uVar20 = (undefined4)((ulong)local_1d8 >> 0x20);
            }
            else {
              dVar21 = SQRT(dVar21);
            }
            local_1d8 = atan((double)CONCAT44(uVar20,uVar19) / dVar21);
            dVar21 = atan2((double)local_180._0_8_,(double)local_180.data);
            pSVar4 = local_1e0;
            (local_1e0->result).BDSelev[(long)local_1c0] = local_1d8;
            (local_1e0->result).BDSAzimuth[(long)local_1c0] = dVar21;
            dVar8 = Hopefield(local_1d8,(local_1e0->result).UserPositionBLH.H,15.0,1013.25,0.5);
            dVar21 = (pSVar4->result).UserPositionBLH.H;
            dVar3 = (*(double *)((long)&(*local_128)->clkdif + lVar15) * 299792458.0 +
                    ((*(double *)((long)(*local_c0)->psr + lVar17) * 2.943681770145979 +
                     *(double *)((long)(*local_c0)->psr + lVar17 + 8) * -1.943681770145979) - dVar11
                    )) - local_160;
            dVar11 = *(double *)(&(*BDSEph)->sys + lVar18 * 2);
            iVar16 = (int)local_1e8;
            pdVar5 = Matrix<double,_-1,_-1>::operator()(&local_f8,(int)local_1e8,0);
            *pdVar5 = ((dVar11 * -7.306023042307046e+26) / 8.278839752039997e+17 + dVar3) -
                      (double)(~-(ulong)(5000.0 < dVar21) & (ulong)dVar8);
            pdVar5 = Matrix<double,_-1,_-1>::operator()(&local_d8,iVar16,0);
            *pdVar5 = local_1c8;
            pdVar5 = Matrix<double,_-1,_-1>::operator()(&local_d8,iVar16,1);
            *pdVar5 = local_1d0;
            pdVar5 = Matrix<double,_-1,_-1>::operator()(&local_d8,iVar16,2);
            *pdVar5 = local_188;
            pdVar5 = Matrix<double,_-1,_-1>::operator()(&local_d8,iVar16,local_168);
            *pdVar5 = 1.0;
            pdVar5 = Matrix<double,_-1,_-1>::operator()(&local_e8,iVar16,iVar16);
            *pdVar5 = 1.0;
            if (local_1f8.data != (double *)0x0) {
              operator_delete__(local_1f8.data);
            }
            local_1e8 = (double)CONCAT44(local_1e8._4_4_,(int)local_1e8 + 1);
            dVar8 = local_1c0;
            uVar9 = local_190;
            ppSVar10 = local_128;
          }
          if ((int)uVar9 == 0) break;
          dVar11 = (double)((long)dVar8 + 1);
          lVar17 = lVar17 + 0x70;
          lVar6 = lVar6 + 0x18;
          lVar15 = lVar15 + 0xb8;
          lVar18 = lVar18 + 0x1b;
        } while ((ulong)dVar8 < 0x3f);
      }
      local_164 = 0;
      local_1b8._0_16_ = Matrix<double,_-1,_-1>::transpose(&local_d8);
      local_180 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_1b8,&local_e8);
      local_1f8 = (Matrix<double,_3,_1>)
                  Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_180,&local_d8);
      local_108 = Matrix<double,_-1,_-1>::inverse((Matrix<double,__1,__1> *)&local_1f8,&local_164);
      local_98 = Matrix<double,-1,-1>::operator*
                           ((Matrix<double,_1,_1> *)&local_108,(Matrix<double,__1,__1> *)&local_1b8)
      ;
      local_a8 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_98,&local_e8);
      local_b8 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_a8,&local_f8);
      if (local_164 == 0) {
        pdVar5 = Matrix<double,_-1,_-1>::operator()(&local_b8,0,0);
        dVar11 = *pdVar5;
        pdVar5 = Matrix<double,_3,_1>::operator()(&local_1a0,0,0);
        *pdVar5 = dVar11 + *pdVar5;
        pdVar5 = Matrix<double,_-1,_-1>::operator()(&local_b8,1,0);
        dVar11 = *pdVar5;
        pdVar5 = Matrix<double,_3,_1>::operator()(&local_1a0,1,0);
        *pdVar5 = dVar11 + *pdVar5;
        pdVar5 = Matrix<double,_-1,_-1>::operator()(&local_b8,2,0);
        dVar11 = *pdVar5;
        pdVar5 = Matrix<double,_3,_1>::operator()(&local_1a0,2,0);
        *pdVar5 = dVar11 + *pdVar5;
        pdVar5 = Matrix<double,_-1,_-1>::operator()(&local_b8,3,0);
        local_158 = local_158 + *pdVar5;
        if ((int)local_190 != 0) {
          pdVar5 = Matrix<double,_-1,_-1>::operator()(&local_b8,local_168,0);
          local_160 = local_160 + *pdVar5;
        }
        local_40 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_d8,&local_b8);
        local_50 = Matrix<double,_-1,_-1>::operator+(&local_40,&local_f8);
        local_60 = Matrix<double,_-1,_-1>::transpose(&local_50);
        local_70 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_60,&local_e8);
        local_80 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_70,&local_50);
        pdVar5 = Matrix<double,_-1,_-1>::operator()(&local_80,0,0);
        GPSPosAndVel = local_150;
        dVar11 = *pdVar5 / local_88;
        if (dVar11 < 0.0) {
          local_1e8 = sqrt(dVar11);
        }
        else {
          local_1e8 = SQRT(dVar11);
        }
        pdVar5 = Matrix<double,_-1,_-1>::operator()(&local_108,0,0);
        dVar11 = *pdVar5;
        pdVar5 = Matrix<double,_-1,_-1>::operator()(&local_108,1,1);
        dVar21 = *pdVar5;
        pdVar5 = Matrix<double,_-1,_-1>::operator()(&local_108,2,2);
        dVar11 = dVar11 + dVar21 + *pdVar5;
        if (dVar11 < 0.0) {
          dVar11 = sqrt(dVar11);
        }
        else {
          dVar11 = SQRT(dVar11);
        }
        (local_1e0->result).UserPositionSigma = local_1e8;
        (local_1e0->result).PDop = dVar11;
        if (local_40.data != (double *)0x0) {
          operator_delete__(local_40.data);
        }
        if (local_50.data != (double *)0x0) {
          operator_delete__(local_50.data);
        }
        if (local_60.data != (double *)0x0) {
          operator_delete__(local_60.data);
        }
        if (local_70.data != (double *)0x0) {
          operator_delete__(local_70.data);
        }
        if (local_80.data != (double *)0x0) {
          operator_delete__(local_80.data);
        }
        local_148.data = (double *)0x0;
        local_148.rows = 3;
        local_148.cols = 1;
        local_148.data = (double *)operator_new__(0x18);
        iVar16 = 0;
        do {
          pdVar5 = Matrix<double,_-1,_-1>::operator()(&local_b8,iVar16,0);
          dVar11 = *pdVar5;
          pdVar5 = Matrix<double,_3,_1>::operator()(&local_148,iVar16,0);
          *pdVar5 = dVar11;
          iVar16 = iVar16 + 1;
        } while (iVar16 < local_148.rows);
        dVar11 = Matrix<double,_3,_1>::norm(&local_148);
        if (1e-05 <= dVar11) {
          if ((double *)local_1b8.Y != (double *)0x0) {
            operator_delete__((void *)local_1b8.Y);
          }
          if (local_180.data != (double *)0x0) {
            operator_delete__(local_180.data);
          }
          if (local_1f8.data != (double *)0x0) {
            operator_delete__(local_1f8.data);
          }
          if (local_108.data != (double *)0x0) {
            operator_delete__(local_108.data);
          }
          if (local_98.data != (double *)0x0) {
            operator_delete__(local_98.data);
          }
          if (local_a8.data != (double *)0x0) {
            operator_delete__(local_a8.data);
          }
          if (local_148.data != (double *)0x0) {
            operator_delete__(local_148.data);
          }
          local_138 = (ulong)((int)local_138 + 1);
          iVar16 = 0;
        }
        else {
          if ((double *)local_1b8.Y != (double *)0x0) {
            operator_delete__((void *)local_1b8.Y);
          }
          if (local_180.data != (double *)0x0) {
            operator_delete__(local_180.data);
          }
          if (local_1f8.data != (double *)0x0) {
            operator_delete__(local_1f8.data);
          }
          if (local_108.data != (double *)0x0) {
            operator_delete__(local_108.data);
          }
          if (local_98.data != (double *)0x0) {
            operator_delete__(local_98.data);
          }
          if (local_a8.data != (double *)0x0) {
            operator_delete__(local_a8.data);
          }
          if (local_148.data != (double *)0x0) {
            operator_delete__(local_148.data);
          }
          iVar16 = 9;
        }
      }
      else {
        if ((double *)local_1b8.Y != (double *)0x0) {
          operator_delete__((void *)local_1b8.Y);
        }
        if (local_180.data != (double *)0x0) {
          operator_delete__(local_180.data);
        }
        GPSPosAndVel = local_150;
        if (local_1f8.data != (double *)0x0) {
          operator_delete__(local_1f8.data);
        }
        if (local_108.data != (double *)0x0) {
          operator_delete__(local_108.data);
        }
        if (local_98.data != (double *)0x0) {
          operator_delete__(local_98.data);
        }
        if (local_a8.data != (double *)0x0) {
          operator_delete__(local_a8.data);
        }
        if (local_e8.data != (double *)0x0) {
          operator_delete__(local_e8.data);
        }
        if (local_f8.data != (double *)0x0) {
          operator_delete__(local_f8.data);
        }
        if (local_1a0.data != (double *)0x0) {
          operator_delete__(local_1a0.data);
        }
        if (local_d8.data != (double *)0x0) {
          operator_delete__(local_d8.data);
        }
        iVar16 = 1;
      }
      if (local_b8.data != (double *)0x0) {
        operator_delete__(local_b8.data);
      }
    } while (iVar16 == 0);
    if (iVar16 == 9) {
LAB_0010e5fd:
      pSVar4 = local_1e0;
      (local_1e0->result).GPSR = local_158;
      (local_1e0->result).BDSR = local_160;
      pdVar5 = Matrix<double,_3,_1>::operator()(&local_1a0,0,0);
      (pSVar4->result).UserPositionXYZ.X = *pdVar5;
      pdVar5 = Matrix<double,_3,_1>::operator()(&local_1a0,1,0);
      (pSVar4->result).UserPositionXYZ.Y = *pdVar5;
      pdVar5 = Matrix<double,_3,_1>::operator()(&local_1a0,2,0);
      (pSVar4->result).UserPositionXYZ.Z = *pdVar5;
      XYZ2BLH((pSVar4->result).UserPositionXYZ,type,&(pSVar4->result).UserPositionBLH);
      XYZ::XYZ(&local_120);
      XYZ2NEU((pSVar4->result).UserRefPositionXYZ,(pSVar4->result).UserPositionXYZ,type,&local_120);
      (pSVar4->result).diffNeu.Z = local_120.Z;
      (pSVar4->result).diffNeu.X = local_120.X;
      (pSVar4->result).diffNeu.Y = local_120.Y;
      if (local_e8.data != (double *)0x0) {
        operator_delete__(local_e8.data);
      }
      if (local_f8.data != (double *)0x0) {
        operator_delete__(local_f8.data);
      }
      if (local_1a0.data != (double *)0x0) {
        operator_delete__(local_1a0.data);
      }
      if (local_d8.data != (double *)0x0) {
        operator_delete__(local_d8.data);
      }
      iVar16 = 0;
    }
    else {
      iVar16 = 5;
    }
  }
  return iVar16;
}

Assistant:

int SPP::solveSPP(Satellite* &&GPSPosAndVel, Satellite* &&BDSPosAndVel,
                  Obs* &&GPSObs, Obs* &&BDSObs, Ephemeris* &&GPSEph,
                  Ephemeris* &&BDSEph, ELLIPSOID type)
{
    int GPSObsNum = 0, BDSObsNum = 0;
    int cols = 5;
    for(int i = 0; i < MAXGPSSRN; ++i)
        if(GPSPosAndVel[i].n != -1)
            GPSObsNum ++;
    for(int i = 0; i < MAXBDSSRN; ++i)
        if(BDSPosAndVel[i].n != -1)
            BDSObsNum ++;

    this->result.BDSObsNum = BDSObsNum;
    this->result.GPSObsNum = GPSObsNum;

    if(GPSObsNum == 0 || BDSObsNum == 0)
        cols = 4;
    if(BDSObsNum ==0 && GPSObsNum <= 4)
        return NOT_ENOUGH_OBS;
    if(GPSObsNum == 0 && BDSObsNum <= 4)
        return NOT_ENOUGH_OBS;
    if(GPSObsNum != 0 && BDSObsNum != 0 && GPSObsNum + BDSObsNum < 5)
        return NOT_ENOUGH_OBS;
    
    // 测站位置
    Vector3d RefPos;
    RefPos.Zero();
    // n * m
    MatrixXd B(BDSObsNum + GPSObsNum, cols);
    // n * n
    MatrixXd P(B.row(), B.row());
    // n * 1
    MatrixXd w(B.row(), 1);
    B.Zero();
    P.Zero();
    int count = 0;
    double GPSR = this->result.GPSR, BDSR = this->result.BDSR;
    
    while (count <= 10)
    {
        int num = 0;
        XYZ station;
        for(int prn = 0; prn < MAXGPSSRN; ++prn)
        {
            if(GPSObsNum == 0)
                break;
            if(GPSPosAndVel[prn].n == -1){
                continue;
            }
            this->result.ObsTime = GPSObs[prn].ObsTime;

            // 地球自转改正
            XYZ fix;
            EarthRotationFix(GPSPosAndVel[prn].deltat, GPSPosAndVel[prn].SatPosition, GPS, fix);
            this->result.GPSPosi[prn] = fix;
            Vector3d SatPos;
            SatPos(0, 0) = fix.X;
            SatPos(1, 0) = fix.Y;
            SatPos(2, 0) = fix.Z;
            double distance = dist(RefPos, SatPos);
            double l = (RefPos(0, 0) - SatPos(0, 0)) / distance;
            double m = (RefPos(1, 0) - SatPos(1, 0)) / distance;
            double n = (RefPos(2, 0) - SatPos(2, 0)) / distance;
            this->result.GPSDist[prn] = distance;

            // 对流层改正
            double T = 0;
            XYZ satNEU;
            station.X = RefPos(0, 0);
            station.Y = RefPos(1, 0);
            station.Z = RefPos(2, 0);
            XYZ2NEU(station, fix, type, satNEU);

            double E = this->CalculateEA(satNEU);
            double A = this->CalculateAzi(satNEU);

            this->result.GPSelev[prn] = E;
            this->result.GPSAzimuth[prn] = A;

            T = Hopefield(E, result.UserPositionBLH.H);
            if(result.UserPositionBLH.H > 5e3)
                T = 0;
            double IFpsr = GPSL1 * GPSL1 / (GPSL1 * GPSL1 - GPSL2 * GPSL2) * GPSObs[prn].psr[0] - 
                           GPSL2 * GPSL2 / (GPSL1 * GPSL1 - GPSL2 * GPSL2) * GPSObs[prn].psr[1];
            // w矩阵
            w(num, 0) = IFpsr - distance + GPSPosAndVel[prn].clkdif * LIGHTSPEED - GPSR - T;
            // B矩阵
            B(num, 0) = l;
            B(num, 1) = m;
            B(num, 2) = n;
            B(num, 3) = 1;

            P(num, num) = 1.0;// / pow(GPSObs[prn].psr_sigma[0] + GPSObs[prn].psr_sigma[1], 2);
            num ++;
            SatPos.deleteMatrix();
        }
        // BDS
        for(int prn = 0; prn < MAXBDSSRN; ++prn)
        {
            if(BDSObsNum == 0)
                break;
            if(BDSPosAndVel[prn].n == -1){
                continue;
            }
            // 几何距离
            XYZ fix;
            EarthRotationFix(BDSPosAndVel[prn].deltat, BDSPosAndVel[prn].SatPosition, BDS, fix);
            this->result.BDSPosi[prn] = fix;
            this->result.ObsTime = BDSObs[prn].ObsTime;
            Vector3d SatPos;
            SatPos(0, 0) = fix.X;
            SatPos(1, 0) = fix.Y;
            SatPos(2, 0) = fix.Z;
            double distance = dist(RefPos, SatPos);
            double l = (RefPos(0, 0) - SatPos(0, 0)) / distance;
            double m = (RefPos(1, 0) - SatPos(1, 0)) / distance;
            double n = (RefPos(2, 0) - SatPos(2, 0)) / distance;
            this->result.BDSDist[prn] = distance;

            // 对流层改正
            double T = 0;
            XYZ satNEU;
            station.X = RefPos(0, 0);
            station.Y = RefPos(1, 0);
            station.Z = RefPos(2, 0);
            XYZ2NEU(station, fix, type, satNEU);

            double E = this->CalculateEA(satNEU);
            double A = this->CalculateAzi(satNEU);
            this->result.BDSelev[prn] = E;
            this->result.BDSAzimuth[prn] = A;

            T = Hopefield(E, result.UserPositionBLH.H);
            if(result.UserPositionBLH.H > 5e3)
                T = 0;
            double IFpsr = BDSB1 * BDSB1 / (BDSB1 * BDSB1 - BDSB3 * BDSB3) * BDSObs[prn].psr[0] - 
                           BDSB3 * BDSB3 / (BDSB1 * BDSB1 - BDSB3 * BDSB3) * BDSObs[prn].psr[1];
            
            // w矩阵
            w(num, 0) = IFpsr - distance + BDSPosAndVel[prn].clkdif * LIGHTSPEED - BDSR -
                        LIGHTSPEED * BDSB1 * BDSB1 * BDSEph[prn].tgd / ((BDSB1 * BDSB1 - BDSB3 * BDSB3)) - T;
            // B矩阵
            B(num, 0) = l;
            B(num, 1) = m;
            B(num, 2) = n;
            if(GPSObsNum == 0)
                B(num, 3) = 1;
            else
                B(num, 4) = 1;

            P(num, num) = 1.0;// / pow(BDSObs[prn].psr_sigma[0] + BDSObs[prn].psr_sigma[1], 2);
            num ++;
            SatPos.deleteMatrix();
        }
        int flag = 0;
        MatrixXd B_T = B.transpose();
        MatrixXd tmp1 = B_T * P;
        MatrixXd tmp2 = tmp1 * B;
        MatrixXd tmp3 = tmp2.inverse(flag);
        MatrixXd tmp4 = tmp3 * B_T;
        MatrixXd tmp5 = tmp4 * P;
        MatrixXd v = tmp5 * w;

        if(flag != 0){
            B_T.deleteMatrix();
            tmp1.deleteMatrix();
            tmp2.deleteMatrix();
            tmp3.deleteMatrix();
            tmp4.deleteMatrix();
            tmp5.deleteMatrix();
            P.deleteMatrix();
            w.deleteMatrix();
            RefPos.deleteMatrix();
            B.deleteMatrix();
            v.deleteMatrix();
            return NOT_INVERTIBLE;
        }
        RefPos(0, 0) += v(0, 0);
        RefPos(1, 0) += v(1, 0);
        RefPos(2, 0) += v(2, 0);
        GPSR += v(3, 0);
        if(GPSObsNum == 0 && BDSObsNum != 0)
            BDSR += v(3, 0);
        else if(BDSObsNum != 0 && GPSObsNum != 0)
            BDSR += v(4, 0);

        MatrixXd tmp6 = B * v;
        MatrixXd tmp7 = tmp6 + w;
        MatrixXd tmp8 = tmp7.transpose();
        MatrixXd tmp9 = tmp8 * P;
        MatrixXd tmp10 = tmp9 * tmp7;

        int Obsnum = 5;
        if(GPSObsNum ==0 || BDSObsNum ==0)
            Obsnum = 4;
        double sigma = sqrt(tmp10(0, 0) / (BDSObsNum + GPSObsNum - Obsnum));
        double pdop = sqrt(tmp3(0, 0) + tmp3(1, 1) + tmp3(2, 2));

        result.UserPositionSigma = sigma;
        result.PDop = pdop;
        tmp6.deleteMatrix();
        tmp7.deleteMatrix();
        tmp8.deleteMatrix();
        tmp9.deleteMatrix();
        tmp10.deleteMatrix();

        Vector3d dx;
        for(int i = 0; i < dx.row(); i++)
            dx(i, 0) = v(i, 0);
        if(dx.norm() < 1e-5)
        {
            B_T.deleteMatrix();
            tmp1.deleteMatrix();
            tmp2.deleteMatrix();
            tmp3.deleteMatrix();
            tmp4.deleteMatrix();
            tmp5.deleteMatrix();
            dx.deleteMatrix();
            v.deleteMatrix();
            break;        
        }
        count ++;

        B_T.deleteMatrix();
        tmp1.deleteMatrix();
        tmp2.deleteMatrix();
        tmp3.deleteMatrix();
        tmp4.deleteMatrix();
        tmp5.deleteMatrix();
        dx.deleteMatrix();
        v.deleteMatrix();
    }
    this->result.GPSR = GPSR;
    this->result.BDSR = BDSR;
    this->result.UserPositionXYZ.X = RefPos(0, 0);
    this->result.UserPositionXYZ.Y = RefPos(1, 0);
    this->result.UserPositionXYZ.Z = RefPos(2, 0);
    XYZ2BLH(result.UserPositionXYZ, type, result.UserPositionBLH);
    XYZ NEU;
    XYZ2NEU(result.UserRefPositionXYZ, result.UserPositionXYZ, type, NEU);
    result.diffNeu = NEU;

    P.deleteMatrix();
    w.deleteMatrix();
    RefPos.deleteMatrix();
    B.deleteMatrix();
    return 0;
}